

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptorProto::EnumDescriptorProto
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  Rep *pRVar1;
  void *pvVar2;
  EnumOptions *from_00;
  uint uVar3;
  void **ppvVar4;
  EnumOptions *this_00;
  int iVar5;
  Arena *arena;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumDescriptorProto_006228a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->value_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->value_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->value_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->value_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar5 = (from->value_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar5 != 0) {
    pRVar1 = (from->value_).super_RepeatedPtrFieldBase.rep_;
    ppvVar4 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->value_).super_RepeatedPtrFieldBase,iVar5);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
              (&(this->value_).super_RepeatedPtrFieldBase,ppvVar4,pRVar1->elements,iVar5,
               ((this->value_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->value_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = iVar5 + (this->value_).super_RepeatedPtrFieldBase.current_size_;
    (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar5;
    pRVar1 = (this->value_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar5) {
      pRVar1->allocated_size = iVar5;
    }
  }
  (this->reserved_range_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar5 = (from->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar5 != 0) {
    pRVar1 = (from->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    ppvVar4 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar5);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::TypeHandler>
              (&(this->reserved_range_).super_RepeatedPtrFieldBase,ppvVar4,pRVar1->elements,iVar5,
               ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = iVar5 + (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
    (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar5;
    pRVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar5) {
      pRVar1->allocated_size = iVar5;
    }
  }
  (this->reserved_name_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar5 = (from->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar5 != 0) {
    pRVar1 = (from->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    ppvVar4 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar5);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->reserved_name_).super_RepeatedPtrFieldBase,ppvVar4,pRVar1->elements,iVar5,
               ((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = iVar5 + (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
    (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar5;
    pRVar1 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar5) {
      pRVar1->allocated_size = iVar5;
    }
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (from->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    arena = (Arena *)(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->name_,arena,(from->name_).ptr_);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar3 & 2) == 0) {
    this_00 = (EnumOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_00 = (EnumOptions *)operator_new(0x50);
    EnumOptions::EnumOptions(this_00,from_00);
  }
  this->options_ = this_00;
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto(const EnumDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      value_(from.value_),
      reserved_range_(from.reserved_range_),
      reserved_name_(from.reserved_name_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::EnumOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumDescriptorProto)
}